

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_command(int cmd,int rep,nh_cmd_arg *arg)

{
  nh_cmd_arg *arg_local;
  int rep_local;
  int cmd_local;
  
  if ((iflags.disable_log == '\0') && (logfile != -1)) {
    lprintf("\n>%llx:%x:%d ",turntime,(ulong)(cmd + 1),(ulong)(uint)rep);
    switch(arg->argtype) {
    case 2:
      lprintf("n");
      break;
    case 4:
      lprintf("d:%d",(ulong)(uint)(arg->field_1).d);
      break;
    case 8:
      lprintf("p:%x:%x",(ulong)(uint)(int)(arg->field_1).pos.x,
              (ulong)(uint)(int)(arg->field_1).pos.y);
      break;
    case 0x10:
      lprintf("o:%c",(ulong)(uint)(int)(arg->field_1).invlet);
    }
  }
  return;
}

Assistant:

void log_command(int cmd, int rep, struct nh_cmd_arg *arg)
{
    if (iflags.disable_log || logfile == -1)
	return;
    
    /* command numbers are shifted by 1, so that they can be array indices during replay */
    lprintf("\n>%llx:%x:%d ", turntime, cmd+1, rep);
    switch (arg->argtype) {
	case CMD_ARG_NONE:
	    lprintf("n");
	    break;
	case CMD_ARG_DIR:
	    lprintf("d:%d", arg->d);
	    break;
	case CMD_ARG_POS:
	    lprintf("p:%x:%x", arg->pos.x, arg->pos.y);
	    break;
	case CMD_ARG_OBJ:
	    lprintf("o:%c", arg->invlet);
	    break;
    }
}